

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O1

int NULLCPugiXML::xml_document__save_file
              (NULLCArray name,NULLCArray indent,int flags,xml_encoding encoding,
              xml_document *document)

{
  xml_document *this;
  bool bVar1;
  char *pcVar2;
  char *error;
  
  pcVar2 = (char *)CONCAT44((int)((ulong)register0x00000030 >> 0x20),name.len);
  if (document->impl == (xml_document_impl *)0x0) {
    error = "xml_document constructor wasn\'t called";
  }
  else {
    this = document->impl->document;
    if (this != (xml_document *)0x0) {
      bVar1 = pugi::xml_document::save_file(this,name.ptr,indent.ptr,flags,encoding);
      return (uint)bVar1;
    }
    error = "xml_document::save document is empty, you must create document first";
    pcVar2 = name.ptr;
  }
  nullcThrowError(error,pcVar2,indent.ptr,
                  CONCAT44((int)((ulong)register0x00000008 >> 0x20),indent.len));
  return 0;
}

Assistant:

int xml_document__save_file(NULLCArray name, NULLCArray indent, int flags, pugi::xml_encoding encoding, xml_document* document)
	{
		if(!document->impl){ nullcThrowError("xml_document constructor wasn't called"); return 0; }
		pugi::xml_document *doc = document->impl->document;
		if(!doc)
		{
			nullcThrowError("xml_document::save document is empty, you must create document first");
			return 0;
		}
		return doc->save_file(name.ptr, indent.ptr, flags, encoding);
	}